

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O0

int __thiscall
tchecker::while_statement_t::clone
          (while_statement_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  undefined4 extraout_var_00;
  while_statement_t *this_00;
  undefined1 local_30 [8];
  shared_ptr<const_tchecker::statement_t> stmt_clone;
  shared_ptr<const_tchecker::expression_t> condition_clone;
  while_statement_t *this_local;
  
  peVar2 = std::
           __shared_ptr_access<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_condition);
  iVar1 = (*peVar2->_vptr_expression_t[2])();
  std::shared_ptr<tchecker::expression_t_const>::shared_ptr<tchecker::expression_t,void>
            ((shared_ptr<tchecker::expression_t_const> *)
             &stmt_clone.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(expression_t *)CONCAT44(extraout_var,iVar1));
  peVar3 = std::
           __shared_ptr_access<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_stmt);
  iVar1 = (*peVar3->_vptr_statement_t[2])();
  std::shared_ptr<tchecker::statement_t_const>::shared_ptr<tchecker::statement_t,void>
            ((shared_ptr<tchecker::statement_t_const> *)local_30,
             (statement_t *)CONCAT44(extraout_var_00,iVar1));
  this_00 = (while_statement_t *)operator_new(0x28);
  while_statement_t(this_00,(shared_ptr<const_tchecker::expression_t> *)
                            &stmt_clone.
                             super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,(shared_ptr<const_tchecker::statement_t> *)local_30);
  std::shared_ptr<const_tchecker::statement_t>::~shared_ptr
            ((shared_ptr<const_tchecker::statement_t> *)local_30);
  std::shared_ptr<const_tchecker::expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::expression_t> *)
             &stmt_clone.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::while_statement_t * while_statement_t::clone() const
{
  std::shared_ptr<tchecker::expression_t const> condition_clone{_condition->clone()};
  std::shared_ptr<tchecker::statement_t const> stmt_clone{_stmt->clone()};
  return new tchecker::while_statement_t(condition_clone, stmt_clone);
}